

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O3

void __thiscall
mocker::DominatorTree::buildImmediateDominator(DominatorTree *this,FunctionModule *func)

{
  _List_node_base *v;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  undefined8 *puVar6;
  _List_node_base *p_Var7;
  _List_node_base *u;
  undefined8 *puVar8;
  size_t node;
  _List_node_base *local_68;
  _List_node_base *local_60;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  p_Var7 = (func->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  local_60 = (_List_node_base *)&func->bbs;
  if (p_Var7 != local_60) {
    local_50 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->immediateDominator;
    local_58 = &(this->dominators)._M_h;
    do {
      local_68 = p_Var7[1]._M_next;
      if (this->reverse == false) {
        u = (_List_node_base *)0xffffffffffffffff;
        if (local_68 != local_60->_M_next[1]._M_next) goto LAB_001529fe;
LAB_001529e1:
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_50,(key_type *)&local_68);
        *pmVar4 = (mapped_type)u;
      }
      else {
        ir::BasicBlock::getSuccessors(&local_48,(BasicBlock *)(p_Var7 + 1));
        puVar2 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar1 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (puVar1 == puVar2) {
          u = (_List_node_base *)0xffffffffffffffff;
          goto LAB_001529e1;
        }
LAB_001529fe:
        iVar5 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_58,(key_type *)&local_68);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        for (puVar8 = *(undefined8 **)
                       ((long)iVar5.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                              ._M_cur + 0x20); puVar8 != (undefined8 *)0x0;
            puVar8 = (undefined8 *)*puVar8) {
          u = (_List_node_base *)puVar8[1];
          if (u != local_68) {
            puVar6 = *(undefined8 **)
                      ((long)iVar5.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                             ._M_cur + 0x20);
            while( true ) {
              if (puVar6 == (undefined8 *)0x0) goto LAB_001529e1;
              v = (_List_node_base *)puVar6[1];
              if (((u != v) && (v != local_68)) &&
                 (bVar3 = isDominating(this,(size_t)u,(size_t)v), bVar3)) break;
              puVar6 = (undefined8 *)*puVar6;
            }
          }
        }
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != local_60);
  }
  return;
}

Assistant:

void DominatorTree::buildImmediateDominator(const ir::FunctionModule &func) {
  // For a faster algorithm, see [Lengauer, Tarjan, 1979]

  for (const auto &bb : func.getBBs()) {
    auto node = bb.getLabelID();
    if (!reverse && node == func.getFirstBBLabel()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }
    if (reverse && bb.getSuccessors().empty()) {
      immediateDominator[node] = std::size_t(-1);
      continue;
    }

    const auto &Dominators = dominators.at(node);
    for (auto dominator : Dominators) {
      if (dominator == node) // is not strict
        continue;
      bool flag = true;
      for (auto otherDominator : Dominators) {
        if (otherDominator == node)
          continue;
        if (isStrictlyDominating(dominator, otherDominator)) {
          flag = false;
          break;
        }
      }
      if (flag) {
        immediateDominator[node] = dominator;
        break;
      }
    }
  }
}